

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O1

void __thiscall OPLio::OPLwritePan(OPLio *this,uint channel,OPL2instrument *instr,int pan)

{
  OPLEmul *pOVar1;
  ulong uVar2;
  byte bVar3;
  double __x;
  double local_30;
  double local_28;
  
  if (instr != (OPL2instrument *)0x0) {
    bVar3 = 0x10;
    if (-0x25 < pan) {
      bVar3 = (pan < 0x25) << 4 | 0x20;
    }
    (*this->_vptr_OPLio[4])
              (this,(ulong)channel / 9,(ulong)(channel % 9 + 0xc0),(ulong)(bVar3 | instr->feedback))
    ;
    uVar2 = (ulong)((uint)this->IsOPL3 + (uint)this->IsOPL3 * 8 + 9);
    pOVar1 = this->chips[channel / uVar2];
    if (pOVar1 != (OPLEmul *)0x0) {
      __x = 0.0;
      if (-0x3f < pan) {
        __x = (double)(pan + 0x3f) * 0.01246663751424521;
      }
      sincos(__x,&local_28,&local_30);
      (*pOVar1->_vptr_OPLEmul[5])
                ((ulong)(uint)(float)local_30,(float)local_28,pOVar1,(ulong)channel % uVar2);
      return;
    }
  }
  return;
}

Assistant:

void OPLio::OPLwritePan(uint channel, struct OPL2instrument *instr, int pan)
{
	if (instr != 0)
	{
		uchar bits;
		if (pan < -36) bits = 0x10;		// left
		else if (pan > 36) bits = 0x20;	// right
		else bits = 0x30;			// both

		OPLwriteValue(0xC0, channel, instr->feedback | bits);

		// Set real panning if we're using emulated chips.
		int chanper = IsOPL3 ? OPL3CHANNELS : OPL2CHANNELS;
		int which = channel / chanper;
		if (chips[which] != NULL)
		{
			// This is the MIDI-recommended pan formula. 0 and 1 are
			// both hard left so that 64 can be perfectly center.
			// (Note that the 'pan' passed to this function is the
			// MIDI pan position, subtracted by 64.)
			double level = (pan <= -63) ? 0 : (pan + 64 - 1) / 126.0;
			chips[which]->SetPanning(channel % chanper,
				(float)cos(HALF_PI * level), (float)sin(HALF_PI * level));
		}
	}
}